

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(void)

{
  puts("testing real... ");
  test_real();
  return 0;
}

Assistant:

int main(void)
{
   printf("testing real... \n");
   test_real();

   #ifdef SOPLEX_WITH_GMP
   printf("\n");
   printf("testing rational... \n");
   test_rational();
   #endif
}